

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O3

void __thiscall despot::MemoryPool<despot::TagState>::NewChunk(MemoryPool<despot::TagState> *this)

{
  pointer *pppCVar1;
  State *this_00;
  iterator __position;
  long lVar2;
  Chunk *chunk;
  Chunk *local_40;
  State *local_38;
  
  local_40 = (Chunk *)operator_new(0x2000);
  lVar2 = 0;
  do {
    this_00 = &local_40->Objects[0].super_State + lVar2;
    despot::State::State(this_00);
    *(undefined ***)this_00 = &PTR__State_0011f3c0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x2000);
  __position._M_current =
       (this->chunks_).
       super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<despot::MemoryPool<despot::TagState>::Chunk*,std::allocator<despot::MemoryPool<despot::TagState>::Chunk*>>
    ::_M_realloc_insert<despot::MemoryPool<despot::TagState>::Chunk*const&>
              ((vector<despot::MemoryPool<despot::TagState>::Chunk*,std::allocator<despot::MemoryPool<despot::TagState>::Chunk*>>
                *)this,__position,&local_40);
  }
  else {
    *__position._M_current = local_40;
    pppCVar1 = &(this->chunks_).
                super__Vector_base<despot::MemoryPool<despot::TagState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::TagState>::Chunk_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  lVar2 = 0x1fe0;
  do {
    local_38 = &local_40->Objects[0].super_State + lVar2;
    std::vector<despot::TagState*,std::allocator<despot::TagState*>>::
    emplace_back<despot::TagState*>
              ((vector<despot::TagState*,std::allocator<despot::TagState*>> *)&this->freelist_,
               (TagState **)&local_38);
    (&local_40->Objects[0].field_0x8)[lVar2] = 0;
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  return;
}

Assistant:

void NewChunk() {
		Chunk* chunk = new Chunk;
		chunks_.push_back(chunk);
		for (int i = Chunk::Size - 1; i >= 0; --i) {
			freelist_.push_back(&chunk->Objects[i]);
			chunk->Objects[i].ClearAllocated();
		}
	}